

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O2

bool __thiscall
ftxui::anon_unknown_5::ResizableSplitBottomBase::OnEvent
          (ResizableSplitBottomBase *this,Event *event)

{
  undefined8 uVar1;
  bool bVar2;
  string *this_00;
  CapturedMouseInterface *pCVar3;
  undefined1 local_e8 [12];
  int local_dc;
  int local_d8;
  int local_d0;
  int local_cc;
  string local_c8 [40];
  undefined1 local_a0 [64];
  undefined1 local_60 [64];
  
  if (event->type_ != Mouse) {
    Event::Event((Event *)local_60,event);
    bVar2 = ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_60);
    this_00 = (string *)(local_60 + 0x18);
    goto LAB_00136aa2;
  }
  this_00 = local_c8;
  Event::Event((Event *)(local_e8 + 8),event);
  pCVar3 = (this->captured_mouse_)._M_t.
           super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
           .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
  if (local_d8 == 0 && pCVar3 != (CapturedMouseInterface *)0x0) {
    (this->captured_mouse_)._M_t.
    super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
    .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
         (CapturedMouseInterface *)0x0;
LAB_001369f0:
    (*pCVar3->_vptr_CapturedMouseInterface[1])();
  }
  else {
    if (local_d8 == 1 && local_dc == 0) {
      bVar2 = Box::Contain(&this->separator_box_,local_d0,local_cc);
      pCVar3 = (this->captured_mouse_)._M_t.
               super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
               .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
      if (!bVar2) goto LAB_00136a8c;
      if (pCVar3 == (CapturedMouseInterface *)0x0) {
        ComponentBase::CaptureMouse((ComponentBase *)local_e8,(Event *)this);
        uVar1 = local_e8._0_8_;
        local_e8._0_8_ = (CapturedMouseInterface *)0x0;
        pCVar3 = (this->captured_mouse_)._M_t.
                 super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
                 .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
        (this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
             (CapturedMouseInterface *)uVar1;
        if ((pCVar3 != (CapturedMouseInterface *)0x0) &&
           ((*pCVar3->_vptr_CapturedMouseInterface[1])(),
           pCVar3 = (CapturedMouseInterface *)local_e8._0_8_,
           (CapturedMouseInterface *)local_e8._0_8_ != (CapturedMouseInterface *)0x0))
        goto LAB_001369f0;
        goto LAB_00136a9f;
      }
    }
    else {
LAB_00136a8c:
      if (pCVar3 == (CapturedMouseInterface *)0x0) {
        Event::Event((Event *)local_a0,(Event *)(local_e8 + 8));
        bVar2 = ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_a0);
        std::__cxx11::string::~string((string *)(local_a0 + 0x18));
        goto LAB_00136aa2;
      }
    }
    *this->main_size_ = (this->global_box_).y_max - local_cc;
  }
LAB_00136a9f:
  bVar2 = true;
LAB_00136aa2:
  std::__cxx11::string::~string(this_00);
  return bVar2;
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(std::move(event));
    return ComponentBase::OnEvent(std::move(event));
  }